

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathCoreRecursive.cpp
# Opt level: O0

void mathCore::do_expansion(expression *a,expression *expandTo,expression *expandFrom)

{
  bool bVar1;
  reference ppeVar2;
  _Self local_d8;
  expression *local_d0;
  expression *child_1;
  iterator iter_1;
  expSet tempSet_1;
  _Self local_68;
  expression *local_60;
  expression *child;
  iterator iter;
  expSet tempSet;
  expression *expandFrom_local;
  expression *expandTo_local;
  expression *a_local;
  
  bVar1 = is_and(a);
  if (bVar1) {
    bVar1 = is_DNF(expandTo);
    if ((bVar1) && (bVar1 = is_sum(expandFrom), bVar1)) {
      distributive_law(a,expandTo,expandFrom);
      std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::multiset
                ((multiset<expression_*,_compareUUID,_std::allocator<expression_*>_> *)&iter);
      child = (expression *)
              std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::begin
                        (&expandTo->contents);
      while( true ) {
        local_68._M_node =
             (_Base_ptr)
             std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::end
                       (&expandTo->contents);
        bVar1 = std::operator!=((_Self *)&child,&local_68);
        if (!bVar1) break;
        ppeVar2 = std::_Rb_tree_const_iterator<expression_*>::operator*
                            ((_Rb_tree_const_iterator<expression_*> *)&child);
        local_60 = *ppeVar2;
        child = (expression *)
                std::multiset<expression*,compareUUID,std::allocator<expression*>>::erase_abi_cxx11_
                          ((multiset<expression*,compareUUID,std::allocator<expression*>> *)
                           &expandTo->contents,(const_iterator)child);
        do_simplification(local_60);
        std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::insert
                  ((multiset<expression_*,_compareUUID,_std::allocator<expression_*>_> *)&iter,
                   &local_60);
      }
      mergeMultiSet(&expandTo->contents,(expSet *)&iter);
      idempotent_law(expandTo);
      universal_bound(expandTo);
      std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::~multiset
                ((multiset<expression_*,_compareUUID,_std::allocator<expression_*>_> *)&iter);
    }
  }
  else {
    bVar1 = is_or(a);
    if (((bVar1) && (bVar1 = is_CNF(expandTo), bVar1)) && (bVar1 = is_product(expandFrom), bVar1)) {
      distributive_law(a,expandTo,expandFrom);
      std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::multiset
                ((multiset<expression_*,_compareUUID,_std::allocator<expression_*>_> *)&iter_1);
      child_1 = (expression *)
                std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::begin
                          (&expandTo->contents);
      while( true ) {
        local_d8._M_node =
             (_Base_ptr)
             std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::end
                       (&expandTo->contents);
        bVar1 = std::operator!=((_Self *)&child_1,&local_d8);
        if (!bVar1) break;
        ppeVar2 = std::_Rb_tree_const_iterator<expression_*>::operator*
                            ((_Rb_tree_const_iterator<expression_*> *)&child_1);
        local_d0 = *ppeVar2;
        child_1 = (expression *)
                  std::multiset<expression*,compareUUID,std::allocator<expression*>>::
                  erase_abi_cxx11_((multiset<expression*,compareUUID,std::allocator<expression*>> *)
                                   &expandTo->contents,(const_iterator)child_1);
        do_simplification(local_d0);
        std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::insert
                  ((multiset<expression_*,_compareUUID,_std::allocator<expression_*>_> *)&iter_1,
                   &local_d0);
      }
      mergeMultiSet(&expandTo->contents,(expSet *)&iter_1);
      idempotent_law(expandTo);
      universal_bound(expandTo);
      std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::~multiset
                ((multiset<expression_*,_compareUUID,_std::allocator<expression_*>_> *)&iter_1);
    }
  }
  return;
}

Assistant:

void mathCore::do_expansion(expression* a, expression* expandTo, expression* expandFrom) {
	if (is_and(a)) {
		// (ABC+DEF)(X+Y)
		// (ABC(X+Y) + DEF(X+Y))
		if (is_DNF(expandTo) && is_sum(expandFrom)) {
			distributive_law(a, expandTo, expandFrom);
			
			expSet tempSet;
			auto iter = expandTo->contents.begin();
			expression* child;

			while (iter != expandTo->contents.end()) {
				child = *iter;
				iter = expandTo->contents.erase(iter);


				do_simplification(child);
				tempSet.insert(child);
			}
			mergeMultiSet(expandTo->contents, tempSet);
			idempotent_law(expandTo);
			universal_bound(expandTo);
		}
	}
	else if (is_or(a)) {
		// (A+B+C)(D+E+F) + (ABCD)
		// (A+B+C+ABCD)(D+E+F+ABCD)
		if (is_CNF(expandTo) && is_product(expandFrom)) {
			distributive_law(a, expandTo, expandFrom);

			expSet tempSet;
			auto iter = expandTo->contents.begin();
			expression* child;

			while (iter != expandTo->contents.end()) {
				child = *iter;
				iter = expandTo->contents.erase(iter);
				do_simplification(child);
				tempSet.insert(child);
			}
			mergeMultiSet(expandTo->contents, tempSet);
			idempotent_law(expandTo);
			universal_bound(expandTo);
		}
	}
}